

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_NormalIterators_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_NormalIterators_Test
          (HashtableAllTest_NormalIterators_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  void *in_RDI;
  
  ~HashtableAllTest_NormalIterators_Test
            ((HashtableAllTest_NormalIterators_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)0xa386b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, NormalIterators) {
  EXPECT_TRUE(this->ht_.begin() == this->ht_.end());
  this->ht_.insert(this->UniqueObject(1));
  {
    typename TypeParam::iterator it = this->ht_.begin();
    EXPECT_TRUE(it != this->ht_.end());
    ++it;
    EXPECT_TRUE(it == this->ht_.end());
  }
}